

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityAssertEqualString(char *expected,char *actual,char *msg,_U_UINT lineNumber)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (Unity.CurrentTestIgnored != 0 || Unity.CurrentTestFailed != 0) {
    return;
  }
  if (actual == (char *)0x0 || expected == (char *)0x0) {
    if (expected == actual) {
      return;
    }
  }
  else {
    uVar1 = 0;
    do {
      uVar2 = (ulong)uVar1;
      uVar3 = (ulong)uVar1;
      if (expected[uVar2] == '\0' && actual[uVar3] == '\0') {
        return;
      }
      uVar1 = uVar1 + 1;
    } while (expected[uVar2] == actual[uVar3]);
  }
  Unity.CurrentTestFailed = 1;
  UnityTestResultsFailBegin(lineNumber);
  UnityPrintExpectedAndActualStrings(expected,actual);
  UnityAddMsgIfSpecified(msg);
  Unity.CurrentTestFailed = 1;
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertEqualString(const char* expected,
                            const char* actual,
                            const char* msg,
                            const UNITY_LINE_TYPE lineNumber)
{
    _UU32 i;

    UNITY_SKIP_EXECUTION;

    /* if both pointers not null compare the strings */
    if (expected && actual)
    {
        for (i = 0; expected[i] || actual[i]; i++)
        {
            if (expected[i] != actual[i])
            {
                Unity.CurrentTestFailed = 1;
                break;
            }
        }
    }
    else
    { /* handle case of one pointers being null (if both null, test should pass) */
        if (expected != actual)
        {
            Unity.CurrentTestFailed = 1;
        }
    }

    if (Unity.CurrentTestFailed)
    {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrintExpectedAndActualStrings(expected, actual);
      UnityAddMsgIfSpecified(msg);
      UNITY_FAIL_AND_BAIL;
    }
}